

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O2

void __thiscall Patch::Node::set_new_text(Node *this,optional<Text> *text)

{
  Text *this_00;
  pointer __p;
  __uniq_ptr_impl<Text,_std::default_delete<Text>_> local_20;
  
  if (text->is_some == true) {
    this_00 = (Text *)operator_new(0x38);
    Text::Text(this_00,&text->value);
    local_20._M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
    super__Head_base<0UL,_Text_*,_false>._M_head_impl =
         (tuple<Text_*,_std::default_delete<Text>_>)
         (_Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>)0x0;
    std::__uniq_ptr_impl<Text,_std::default_delete<Text>_>::reset
              ((__uniq_ptr_impl<Text,_std::default_delete<Text>_> *)&this->new_text,this_00);
    std::unique_ptr<Text,_std::default_delete<Text>_>::~unique_ptr
              ((unique_ptr<Text,_std::default_delete<Text>_> *)&local_20);
    return;
  }
  std::__uniq_ptr_impl<Text,_std::default_delete<Text>_>::reset
            ((__uniq_ptr_impl<Text,_std::default_delete<Text>_> *)&this->new_text,(pointer)0x0);
  return;
}

Assistant:

void set_new_text(optional<Text> &&text) {
    if (text) {
      new_text = unique_ptr<Text>{new Text{move(*text)}};
    } else {
      new_text = nullptr;
    }
  }